

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::MoveMemFromConstPattern::TryToGenerateCode
          (MoveMemFromConstPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMemExpression *this_00;
  CExpression *pCVar1;
  CConstExpression *this_01;
  undefined1 local_31;
  shared_ptr<AssemblyCode::MoveMemFromConstCommand> local_30;
  int local_1c;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
    if (this_00 == (CMemExpression *)0x0) {
      return false;
    }
    pCVar1 = CMemExpression::getAddress(this_00);
    if (pCVar1 != (CExpression *)0x0) {
      this_01 = (CConstExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
      if (this_01 == (CConstExpression *)0x0) {
        return false;
      }
      local_1c = CConstExpression::getValue(this_01);
      local_30.super___shared_ptr<AssemblyCode::MoveMemFromConstCommand,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveMemFromConstCommand,std::allocator<AssemblyCode::MoveMemFromConstCommand>,IRT::CTemp_const&,int>
                (&local_30.
                  super___shared_ptr<AssemblyCode::MoveMemFromConstCommand,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(MoveMemFromConstCommand **)&local_30,
                 (allocator<AssemblyCode::MoveMemFromConstCommand> *)&local_31,dest,&local_1c);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromConstCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,&local_30);
      if (local_30.
          super___shared_ptr<AssemblyCode::MoveMemFromConstCommand,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<AssemblyCode::MoveMemFromConstCommand,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::MoveMemFromConstPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                 ChildrenTemps &children,
                                                 AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(memPtr->getAddress( ));
        if ( constPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveMemFromConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}